

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall
cfd::core::Psbt::SetTxOutData
          (Psbt *this,uint32_t index,Script *redeem_script,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  void *pvVar1;
  long lVar2;
  bool bVar3;
  uchar *puVar4;
  size_type sVar5;
  CfdException *pCVar6;
  allocator local_261;
  string local_260;
  CfdSourceLocation local_240;
  undefined1 local_222;
  allocator local_221;
  string local_220;
  CfdSourceLocation local_200;
  Script local_1e8;
  ByteData local_1b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  undefined1 local_17a;
  allocator local_179;
  string local_178;
  CfdSourceLocation local_158;
  ByteData local_140;
  undefined1 local_128 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  int ret;
  bool is_witness;
  Script new_redeem_script;
  Txid txid;
  ByteData256 empty_bytes;
  ByteData local_88;
  undefined1 local_70 [8];
  Script script;
  wally_tx_output *txout;
  wally_psbt *psbt_pointer;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list_local;
  Script *redeem_script_local;
  uint32_t index_local;
  Psbt *this_local;
  
  (*this->_vptr_Psbt[3])(this,(ulong)index,0xb8b,"SetTxOutData");
  pvVar1 = this->wally_psbt_pointer_;
  script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(*(long *)(*(long *)((long)pvVar1 + 8) + 0x20) + (ulong)index * 0x70);
  ByteData::ByteData(&local_88,
                     *(uint8_t **)
                      &(script.script_stack_.
                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->type_,
                     *(uint32_t *)
                      &((script.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->op_code_).
                       _vptr_ScriptOperator);
  Script::Script((Script *)local_70,&local_88);
  ByteData::~ByteData(&local_88);
  ByteData256::ByteData256
            ((ByteData256 *)
             &txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  Txid::Txid((Txid *)&new_redeem_script.script_stack_.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (ByteData256 *)
             &txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  Script::Script((Script *)&ret,redeem_script);
  script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ =
       ValidatePsbtUtxo((Txid *)&new_redeem_script.script_stack_.
                                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,index,
                        (Script *)local_70,redeem_script,key_list,(Script *)&ret);
  bVar3 = Script::IsEmpty((Script *)&ret);
  if (!bVar3) {
    Script::GetData(&local_140,(Script *)&ret);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128,&local_140
                      );
    ByteData::~ByteData(&local_140);
    if (((script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) &&
       (bVar3 = Script::IsP2wpkhScript((Script *)&ret), !bVar3)) {
      lVar2 = *(long *)((long)pvVar1 + 0x28);
      puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
      sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
      script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           wally_psbt_output_set_witness_script(lVar2 + (ulong)index * 0xd0,puVar4,sVar5);
      if ((int)script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage != 0) {
        local_158.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_158.filename = local_158.filename + 1;
        local_158.line = 0xba0;
        local_158.funcname = "SetTxOutData";
        logger::warn<int&>(&local_158,"wally_psbt_output_set_witness_script NG[{}]",
                           (int *)&script_val.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_17a = 1;
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_178,"psbt add output witness script error.",&local_179);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_178);
        local_17a = 0;
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      bVar3 = Script::IsP2shScript((Script *)local_70);
      if (bVar3) {
        ScriptUtil::CreateP2wshLockingScript(&local_1e8,(Script *)&ret);
        Script::GetData(&local_1b0,&local_1e8);
        ByteData::GetBytes(&local_198,&local_1b0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128,&local_198);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_198);
        ByteData::~ByteData(&local_1b0);
        Script::~Script(&local_1e8);
      }
      else {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
      }
    }
    bVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
    if (!bVar3) {
      lVar2 = *(long *)((long)pvVar1 + 0x28);
      puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
      sVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
      script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           wally_psbt_output_set_redeem_script(lVar2 + (ulong)index * 0xd0,puVar4,sVar5);
      if ((int)script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage != 0) {
        local_200.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_200.filename = local_200.filename + 1;
        local_200.line = 0xbb2;
        local_200.funcname = "SetTxOutData";
        logger::warn<int&>(&local_200,"wally_psbt_output_set_redeem_script NG[{}]",
                           (int *)&script_val.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_222 = 1;
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_220,"psbt add output redeem script error.",&local_221);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_220);
        local_222 = 0;
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
  }
  bVar3 = ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::empty(key_list);
  if (!bVar3) {
    SetKeyPathMap(key_list,(wally_map *)
                           (*(long *)((long)pvVar1 + 0x28) + 0x20 + (ulong)index * 0xd0));
    script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         wally_map_sort(*(long *)((long)pvVar1 + 0x28) + 0x20 + (ulong)index * 0xd0,0);
    if ((int)script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage != 0) {
      local_240.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_240.filename = local_240.filename + 1;
      local_240.line = 0xbbd;
      local_240.funcname = "SetTxOutData";
      logger::warn<int&>(&local_240,"wally_map_sort NG[{}]",
                         (int *)&script_val.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_260,"psbt output sort keypaths error.",&local_261);
      CfdException::CfdException(pCVar6,kCfdInternalError,&local_260);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  }
  Script::~Script((Script *)&ret);
  Txid::~Txid((Txid *)&new_redeem_script.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData256::~ByteData256
            ((ByteData256 *)
             &txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  Script::~Script((Script *)local_70);
  return;
}

Assistant:

void Psbt::SetTxOutData(
    uint32_t index, const Script &redeem_script,
    const std::vector<KeyData> &key_list) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  struct wally_tx_output *txout = &psbt_pointer->tx->outputs[index];
  Script script(
      ByteData(txout->script, static_cast<uint32_t>(txout->script_len)));
  ByteData256 empty_bytes;
  Txid txid(empty_bytes);
  Script new_redeem_script = redeem_script;
  bool is_witness = ValidatePsbtUtxo(
      txid, index, script, redeem_script, key_list, &new_redeem_script);

  int ret;
  if (!new_redeem_script.IsEmpty()) {
    auto script_val = new_redeem_script.GetData().GetBytes();
    if (is_witness && (!new_redeem_script.IsP2wpkhScript())) {
      ret = wally_psbt_output_set_witness_script(
          &psbt_pointer->outputs[index], script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        warn(
            CFD_LOG_SOURCE, "wally_psbt_output_set_witness_script NG[{}]",
            ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add output witness script error.");
      }
      if (script.IsP2shScript()) {
        script_val = ScriptUtil::CreateP2wshLockingScript(new_redeem_script)
                         .GetData()
                         .GetBytes();
      } else {
        script_val.clear();
      }
    }
    if (!script_val.empty()) {
      ret = wally_psbt_output_set_redeem_script(
          &psbt_pointer->outputs[index], script_val.data(), script_val.size());
      if (ret != WALLY_OK) {
        warn(
            CFD_LOG_SOURCE, "wally_psbt_output_set_redeem_script NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt add output redeem script error.");
      }
    }
  }

  if (!key_list.empty()) {
    SetKeyPathMap(key_list, &psbt_pointer->outputs[index].keypaths);
    ret = wally_map_sort(&psbt_pointer->outputs[index].keypaths, 0);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
      throw CfdException(
          kCfdInternalError, "psbt output sort keypaths error.");
    }
  }
}